

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyi_generator.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::python::PyiGenerator::Generate
          (PyiGenerator *this,FileDescriptor *file,string *parameter,GeneratorContext *context,
          string *error)

{
  Printer *this_00;
  Options options_00;
  string_view suffix;
  bool bVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  undefined4 extraout_var;
  pointer pZVar5;
  LogMessage *pLVar6;
  FileDescriptor *descriptor;
  EnumDescriptor *pEVar7;
  AlphaNum *b;
  undefined1 auVar8 [16];
  string_view sVar9;
  string_view suffix_00;
  optional<bool> *local_428;
  int local_3ec;
  int i_2;
  EnumDescriptor *enum_descriptor;
  int i_1;
  FileDescriptor *public_dep;
  undefined1 auStack_3c8 [4];
  int i;
  undefined1 local_3b8 [16];
  AnnotationCollector *local_3a8;
  size_t sStack_3a0;
  char *local_398;
  size_t sStack_390;
  char *local_388;
  size_t sStack_380;
  undefined1 local_378 [8];
  Printer printer;
  undefined1 auStack_240 [8];
  Options printer_opt;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> annotation_collector;
  GeneratedCodeInfo annotations;
  LogMessage local_1b8;
  Voidify local_1a1;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  local_1a0;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  output;
  char *local_190;
  string local_188;
  undefined4 local_164;
  AlphaNum local_160;
  AlphaNum local_130;
  string local_100;
  basic_string_view<char,_std::char_traits<char>_> local_e0;
  string_view local_d0;
  reference local_c0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *option;
  iterator __end3;
  iterator __begin3;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range3;
  string local_98 [7];
  bool annotate_code;
  string filename;
  undefined1 local_68 [8];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  options;
  MutexLock local_40;
  MutexLock lock;
  string *error_local;
  GeneratorContext *context_local;
  string *parameter_local;
  FileDescriptor *file_local;
  PyiGenerator *this_local;
  
  lock.mu_ = (Mutex *)error;
  absl::lts_20250127::MutexLock::MutexLock(&local_40,&this->mutex_);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)&this->import_map_);
  this->file_ = file;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_68);
  auVar8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)parameter);
  filename.field_2._8_8_ = auVar8._0_8_;
  sVar9._M_str = (char *)local_68;
  sVar9._M_len = auVar8._8_8_;
  ParseGeneratorParameter
            ((compiler *)filename.field_2._8_8_,sVar9,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)filename.field_2._8_8_);
  std::__cxx11::string::string(local_98);
  bVar2 = false;
  this->strip_nonfunctional_codegen_ = false;
  __end3 = std::
           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_68);
  option = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_68);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end3,(__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                *)&option);
    if (!bVar1) {
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) != 0) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&output,".pyi");
        suffix_00._M_str = (char *)error;
        suffix_00._M_len = (size_t)local_190;
        GetFileName_abi_cxx11_
                  (&local_188,(python *)file,
                   (FileDescriptor *)
                   output._M_t.
                   super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                   .super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>.
                   _M_head_impl,suffix_00);
        std::__cxx11::string::operator=(local_98,(string *)&local_188);
        std::__cxx11::string::~string((string *)&local_188);
      }
      iVar3 = (*context->_vptr_GeneratorContext[2])(context,local_98);
      std::
      unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
      ::unique_ptr<std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,void>
                ((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
                  *)&local_1a0,(pointer)CONCAT44(extraout_var,iVar3));
      pZVar5 = std::
               unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
               ::get(&local_1a0);
      if (pZVar5 == (pointer)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_1b8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/python/pyi_generator.cc"
                   ,0x272,"output.get()");
        pLVar6 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_1b8);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_1a1,pLVar6);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_1b8);
      }
      GeneratedCodeInfo::GeneratedCodeInfo
                ((GeneratedCodeInfo *)&annotation_collector.annotation_proto_);
      protobuf::io::AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo>::
      AnnotationProtoCollector
                ((AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *)
                 &printer_opt.enable_codegen_trace,
                 (GeneratedCodeInfo *)&annotation_collector.annotation_proto_);
      if (bVar2) {
        local_428 = &printer_opt.enable_codegen_trace;
      }
      else {
        local_428 = (optional<bool> *)0x0;
      }
      protobuf::io::Printer::Options::Options
                ((Options *)auStack_240,'$',(AnnotationCollector *)local_428);
      printer_opt.ignored_comment_start._M_str = (char *)0x4;
      pZVar5 = std::
               unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
               ::get(&local_1a0);
      local_388 = printer_opt.ignored_comment_start._M_str;
      sStack_380 = printer_opt.spaces_per_indent;
      local_398 = printer_opt.comment_start._M_str;
      sStack_390 = printer_opt.ignored_comment_start._M_len;
      local_3a8 = printer_opt.annotation_collector;
      sStack_3a0 = printer_opt.comment_start._M_len;
      local_3b8._0_8_ = auStack_240;
      local_3b8._8_8_ = printer_opt._0_8_;
      options_00.annotation_collector = (AnnotationCollector *)printer_opt._0_8_;
      options_00._0_8_ = auStack_240;
      options_00.comment_start._M_len = (size_t)printer_opt.annotation_collector;
      options_00.comment_start._M_str = (char *)printer_opt.comment_start._M_len;
      options_00.ignored_comment_start._M_len = (size_t)printer_opt.comment_start._M_str;
      options_00.ignored_comment_start._M_str = (char *)printer_opt.ignored_comment_start._M_len;
      options_00.spaces_per_indent = (size_t)printer_opt.ignored_comment_start._M_str;
      options_00._56_8_ = printer_opt.spaces_per_indent;
      protobuf::io::Printer::Printer((Printer *)local_378,pZVar5,options_00);
      this->printer_ = (Printer *)local_378;
      PrintImports(this);
      this_00 = this->printer_;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)auStack_3c8,
                 "DESCRIPTOR: _descriptor.FileDescriptor\n");
      protobuf::io::Printer::Print<>(this_00,_auStack_3c8);
      public_dep._4_4_ = 0;
      while( true ) {
        iVar3 = FileDescriptor::public_dependency_count(this->file_);
        if (iVar3 <= public_dep._4_4_) break;
        descriptor = FileDescriptor::public_dependency(this->file_,public_dep._4_4_);
        PrintExtensions<google::protobuf::FileDescriptor>(this,descriptor);
        enum_descriptor._4_4_ = 0;
        while( true ) {
          iVar3 = FileDescriptor::enum_type_count(descriptor);
          if (iVar3 <= enum_descriptor._4_4_) break;
          pEVar7 = FileDescriptor::enum_type(descriptor,enum_descriptor._4_4_);
          PrintEnumValues(this,pEVar7,false);
          enum_descriptor._4_4_ = enum_descriptor._4_4_ + 1;
        }
        public_dep._4_4_ = public_dep._4_4_ + 1;
      }
      PrintTopLevelEnums(this);
      local_3ec = 0;
      while( true ) {
        iVar3 = FileDescriptor::enum_type_count(this->file_);
        if (iVar3 <= local_3ec) break;
        pEVar7 = FileDescriptor::enum_type(this->file_,local_3ec);
        PrintEnumValues(this,pEVar7,false);
        local_3ec = local_3ec + 1;
      }
      PrintExtensions<google::protobuf::FileDescriptor>(this,this->file_);
      PrintMessages(this);
      if ((this->opensource_runtime_ & 1U) != 0) {
        bVar2 = HasGenericServices(file);
        if (bVar2) {
          PrintServices(this);
        }
      }
      this_local._7_1_ = true;
      local_164 = 1;
      protobuf::io::Printer::~Printer((Printer *)local_378);
      protobuf::io::AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo>::
      ~AnnotationProtoCollector
                ((AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *)
                 &printer_opt.enable_codegen_trace);
      GeneratedCodeInfo::~GeneratedCodeInfo
                ((GeneratedCodeInfo *)&annotation_collector.annotation_proto_);
      std::
      unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
      ::~unique_ptr(&local_1a0);
LAB_01772581:
      std::__cxx11::string::~string(local_98);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_68);
      absl::lts_20250127::MutexLock::~MutexLock(&local_40);
      return this_local._7_1_;
    }
    local_c0 = __gnu_cxx::
               __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator*(&__end3);
    bVar1 = std::operator==(&local_c0->first,"annotate_code");
    if (bVar1) {
      bVar2 = true;
    }
    else {
      sVar9 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_c0);
      local_d0 = sVar9;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_e0,".pyi");
      suffix._M_str = local_e0._M_str;
      suffix._M_len = local_e0._M_len;
      b = (AlphaNum *)local_e0._M_str;
      bVar1 = absl::lts_20250127::EndsWith(local_d0,suffix);
      if (bVar1) {
        std::__cxx11::string::operator=(local_98,(string *)local_c0);
      }
      else {
        bVar1 = std::operator==(&local_c0->first,"experimental_strip_nonfunctional_codegen");
        if (!bVar1) {
          absl::lts_20250127::AlphaNum::AlphaNum(&local_130,"Unknown generator option: ");
          absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_160,&local_c0->first);
          absl::lts_20250127::StrCat_abi_cxx11_(&local_100,(lts_20250127 *)&local_130,&local_160,b);
          std::__cxx11::string::operator=((string *)lock.mu_,(string *)&local_100);
          std::__cxx11::string::~string((string *)&local_100);
          this_local._7_1_ = false;
          local_164 = 1;
          goto LAB_01772581;
        }
        this->strip_nonfunctional_codegen_ = true;
      }
    }
    __gnu_cxx::
    __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator++(&__end3);
  } while( true );
}

Assistant:

bool PyiGenerator::Generate(const FileDescriptor* file,
                            const std::string& parameter,
                            GeneratorContext* context,
                            std::string* error) const {
  absl::MutexLock lock(&mutex_);
  import_map_.clear();
  // Calculate file name.
  file_ = file;
  // In google3, devtools/python/bazel/pytype/pytype_impl.bzl uses --pyi_out to
  // directly set the output file name.
  std::vector<std::pair<std::string, std::string> > options;
  ParseGeneratorParameter(parameter, &options);

  std::string filename;
  bool annotate_code = false;
  strip_nonfunctional_codegen_ = false;
  for (const std::pair<std::string, std::string>& option : options) {
    if (option.first == "annotate_code") {
      annotate_code = true;
    } else if (absl::EndsWith(option.first, ".pyi")) {
      filename = option.first;
    } else if (option.first == "experimental_strip_nonfunctional_codegen") {
      strip_nonfunctional_codegen_ = true;
    } else {
      *error = absl::StrCat("Unknown generator option: ", option.first);
      return false;
    }
  }

  if (filename.empty()) {
    filename = GetFileName(file, ".pyi");
  }

  std::unique_ptr<io::ZeroCopyOutputStream> output(context->Open(filename));
  ABSL_CHECK(output.get());
  GeneratedCodeInfo annotations;
  io::AnnotationProtoCollector<GeneratedCodeInfo> annotation_collector(
      &annotations);
  io::Printer::Options printer_opt(
      '$', annotate_code ? &annotation_collector : nullptr);
  printer_opt.spaces_per_indent = 4;
  io::Printer printer(output.get(), printer_opt);
  printer_ = &printer;

  PrintImports();
  printer_->Print("DESCRIPTOR: _descriptor.FileDescriptor\n");

  // Prints extensions and enums from imports.
  for (int i = 0; i < file_->public_dependency_count(); ++i) {
    const FileDescriptor* public_dep = file_->public_dependency(i);
    PrintExtensions(*public_dep);
    for (int i = 0; i < public_dep->enum_type_count(); ++i) {
      const EnumDescriptor* enum_descriptor = public_dep->enum_type(i);
      PrintEnumValues(*enum_descriptor);
    }
  }

  PrintTopLevelEnums();
  // Prints top level enum values
  for (int i = 0; i < file_->enum_type_count(); ++i) {
    PrintEnumValues(*file_->enum_type(i));
  }
  // Prints top level Extensions
  PrintExtensions(*file_);
  PrintMessages();

  if (opensource_runtime_ && HasGenericServices(file)) {
    PrintServices();
  }
  return true;
}